

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

void coda_XML_DefaultCurrent(XML_Parser parser)

{
  OPEN_INTERNAL_ENTITY *pOVar1;
  
  if ((parser != (XML_Parser)0x0) && (parser->m_defaultHandler != (XML_DefaultHandler)0x0)) {
    pOVar1 = parser->m_openInternalEntities;
    if (pOVar1 != (OPEN_INTERNAL_ENTITY *)0x0) {
      reportDefault(parser,parser->m_internalEncoding,pOVar1->internalEventPtr,
                    pOVar1->internalEventEndPtr);
      return;
    }
    reportDefault(parser,parser->m_encoding,parser->m_eventPtr,parser->m_eventEndPtr);
    return;
  }
  return;
}

Assistant:

void XMLCALL
XML_DefaultCurrent(XML_Parser parser) {
  if (parser == NULL)
    return;
  if (parser->m_defaultHandler) {
    if (parser->m_openInternalEntities)
      reportDefault(parser, parser->m_internalEncoding,
                    parser->m_openInternalEntities->internalEventPtr,
                    parser->m_openInternalEntities->internalEventEndPtr);
    else
      reportDefault(parser, parser->m_encoding, parser->m_eventPtr,
                    parser->m_eventEndPtr);
  }
}